

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall
ON_NurbsSurface::IsDuplicate
          (ON_NurbsSurface *this,ON_NurbsSurface *other,bool bIgnoreParameterization,
          double tolerance)

{
  int dim;
  int iVar1;
  int count;
  int stride;
  int other_stride;
  double *cv;
  double *other_cv;
  bool local_39;
  int local_30;
  bool local_29;
  int i;
  bool rc;
  double tolerance_local;
  bool bIgnoreParameterization_local;
  ON_NurbsSurface *other_local;
  ON_NurbsSurface *this_local;
  
  local_29 = this == other;
  if ((((!local_29) && (this->m_dim == other->m_dim)) && (this->m_is_rat == other->m_is_rat)) &&
     (((this->m_order[0] == other->m_order[0] && (this->m_order[1] == other->m_order[1])) &&
      ((this->m_cv_count[0] == other->m_cv_count[0] && (this->m_cv_count[1] == other->m_cv_count[1])
       ))))) {
    local_29 = ON_IsDuplicateKnotVector
                         (this->m_order[0],this->m_cv_count[0],this->m_knot[0],other->m_knot[0],
                          bIgnoreParameterization);
    if (local_29) {
      local_29 = ON_IsDuplicateKnotVector
                           (this->m_order[1],this->m_cv_count[1],this->m_knot[1],other->m_knot[1],
                            bIgnoreParameterization);
    }
    local_30 = 0;
    while( true ) {
      local_39 = false;
      if (local_30 < this->m_cv_count[0]) {
        local_39 = local_29;
      }
      if (local_39 == false) break;
      dim = this->m_dim;
      iVar1 = this->m_is_rat;
      count = this->m_cv_count[1];
      stride = this->m_cv_stride[1];
      cv = CV(this,local_30,0);
      other_stride = other->m_cv_stride[1];
      other_cv = CV(other,local_30,0);
      local_29 = ON_IsDuplicatePointList
                           (dim,iVar1 != 0,count,stride,cv,other_stride,other_cv,tolerance);
      local_30 = local_30 + 1;
    }
  }
  return local_29;
}

Assistant:

bool ON_NurbsSurface::IsDuplicate( 
        const ON_NurbsSurface& other, 
        bool bIgnoreParameterization,
        double tolerance 
        ) const
{
  bool rc = (this == &other);
  if ( !rc
       && m_dim      == other.m_dim
       && m_is_rat   == other.m_is_rat
       && m_order[0] == other.m_order[0]
       && m_order[1] == other.m_order[1]
       && m_cv_count[0] == other.m_cv_count[0]
       && m_cv_count[1] == other.m_cv_count[1]
       )
  {
    // compare knots
    rc = ON_IsDuplicateKnotVector( m_order[0], m_cv_count[0], m_knot[0], other.m_knot[0], bIgnoreParameterization );
    if (rc)
      rc = ON_IsDuplicateKnotVector( m_order[1], m_cv_count[1], m_knot[1], other.m_knot[1], bIgnoreParameterization );

    // compare control points
    int i;
    for ( i = 0; i < m_cv_count[0] && rc; i++ )
    {
      rc = ON_IsDuplicatePointList( m_dim, m_is_rat?1:0, m_cv_count[1],
                                    m_cv_stride[1], CV(i,0),
                                    other.m_cv_stride[1], other.CV(i,0),
                                    tolerance );
    }
  }
  return rc;
}